

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* get_2d_sincos_pos_embed(int embed_dim,pair<int,_int> image_size)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  allocator_type *__a;
  size_type __n;
  undefined8 in_RDX;
  int in_ESI;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_RDI;
  int w_2;
  int h_2;
  int W;
  int H;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  pos_embed_3d;
  int w_1;
  int h_1;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  grid_2d;
  int w;
  int h;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  grid;
  int i_1;
  int i;
  vector<float,_std::allocator<float>_> grid_w;
  vector<float,_std::allocator<float>_> grid_h;
  int grid_w_size;
  int grid_h_size;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *pos_embed_2d;
  allocator_type *in_stack_fffffffffffffdb8;
  allocator_type *__a_00;
  allocator_type *in_stack_fffffffffffffdc0;
  size_type in_stack_fffffffffffffdc8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffdd0;
  vector<float,_std::allocator<float>_> *this;
  allocator_type *in_stack_fffffffffffffdd8;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *in_stack_fffffffffffffde0;
  initializer_list<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  in_stack_fffffffffffffde8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  value_type vVar4;
  undefined4 in_stack_fffffffffffffe04;
  undefined1 **local_1e8;
  vector<float,_std::allocator<float>_> *__x;
  float in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  int local_174;
  undefined4 in_stack_fffffffffffffe90;
  int iVar5;
  undefined4 in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe9c;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  local_140;
  int local_124;
  int local_120;
  undefined8 *local_118;
  undefined1 *local_110 [3];
  undefined1 local_f8 [24];
  undefined8 *local_e0;
  undefined8 local_d8;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  local_d0;
  int local_b4;
  int local_b0;
  vector<float,_std::allocator<float>_> local_a9;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_90;
  int local_74;
  int local_70;
  vector<float,_std::allocator<float>_> local_68 [2];
  vector<float,_std::allocator<float>_> local_38;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 local_10;
  
  local_10._0_4_ = (int)in_RDX;
  local_18 = (int)local_10;
  local_10._4_4_ = (int)((ulong)in_RDX >> 0x20);
  local_1c = local_10._4_4_;
  local_14 = in_ESI;
  local_10 = in_RDX;
  std::allocator<float>::allocator((allocator<float> *)0x1a2a32);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::allocator<float>::~allocator((allocator<float> *)0x1a2a5e);
  std::allocator<float>::allocator((allocator<float> *)0x1a2a83);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::allocator<float>::~allocator((allocator<float> *)0x1a2aaf);
  for (local_70 = 0; local_70 < local_18; local_70 = local_70 + 1) {
    in_stack_fffffffffffffe54 = (float)local_70;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_70);
    *pvVar1 = in_stack_fffffffffffffe54;
  }
  for (local_74 = 0; local_74 < local_1c; local_74 = local_74 + 1) {
    in_stack_fffffffffffffe50 = (float)local_74;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](local_68,(long)local_74);
    *pvVar1 = in_stack_fffffffffffffe50;
  }
  __x = &local_a9;
  std::allocator<float>::allocator((allocator<float> *)0x1a2bf8);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1a2c2c);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
           (value_type *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1a2c60);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdc0);
  std::allocator<float>::~allocator((allocator<float> *)0x1a2c7a);
  for (local_b0 = 0; local_b0 < local_18; local_b0 = local_b0 + 1) {
    for (local_b4 = 0; local_b4 < local_1c; local_b4 = local_b4 + 1) {
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](local_68,(long)local_b4);
      vVar4 = *pvVar1;
      pvVar2 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&local_90,(long)local_b0);
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](pvVar2,(long)local_b4);
      *pvVar1 = vVar4;
    }
  }
  local_118 = local_110;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
           in_stack_fffffffffffffdf8);
  local_118 = (undefined8 *)local_f8;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
           in_stack_fffffffffffffdf8);
  local_e0 = local_110;
  local_d8 = 2;
  std::
  allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
               *)0x1a2df9);
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::vector(in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,in_stack_fffffffffffffdd8);
  std::
  allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                *)0x1a2e2a);
  local_1e8 = (undefined1 **)&local_e0;
  do {
    local_1e8 = local_1e8 + -3;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffffdc0);
  } while (local_1e8 != local_110);
  for (local_120 = 0; local_120 < local_18; local_120 = local_120 + 1) {
    for (local_124 = 0; local_124 < local_1c; local_124 = local_124 + 1) {
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_120);
      vVar4 = *pvVar1;
      pvVar3 = std::
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ::operator[](&local_d0,0);
      pvVar2 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](pvVar3,(long)local_120);
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](pvVar2,(long)local_124);
      *pvVar1 = vVar4;
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](local_68,(long)local_124);
      vVar4 = *pvVar1;
      pvVar3 = std::
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ::operator[](&local_d0,1);
      pvVar2 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](pvVar3,(long)local_120);
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](pvVar2,(long)local_124);
      *pvVar1 = vVar4;
    }
  }
  get_2d_sincos_pos_embed_from_grid
            (in_stack_fffffffffffffe9c,
             (vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  __a = (allocator_type *)(long)((int)local_10 * local_10._4_4_);
  __n = (size_type)local_14;
  this = (vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffe97;
  std::allocator<float>::allocator((allocator<float> *)0x1a30c1);
  std::vector<float,_std::allocator<float>_>::vector(this,__n,__a);
  __a_00 = (allocator_type *)&stack0xfffffffffffffe96;
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1a30ec);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)this,__n,(value_type *)__a,__a_00);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1a311a);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  std::allocator<float>::~allocator((allocator<float> *)0x1a3134);
  for (iVar5 = 0; iVar5 < (int)local_10; iVar5 = iVar5 + 1) {
    for (local_174 = 0; local_174 < local_10._4_4_; local_174 = local_174 + 1) {
      pvVar3 = std::
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ::operator[](&local_140,(long)iVar5);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](pvVar3,(long)local_174);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](in_RDI,(long)(local_174 * (int)local_10 + iVar5));
      std::vector<float,_std::allocator<float>_>::operator=
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),__x);
    }
  }
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
             *)__a);
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
             *)__a);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)__a);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  return in_RDI;
}

Assistant:

static std::vector<std::vector<float>> get_2d_sincos_pos_embed(int embed_dim, const std::pair<int, int> image_size) {
    int grid_h_size = image_size.first;
    int grid_w_size = image_size.second;

    std::vector<float> grid_h(grid_h_size);
    std::vector<float> grid_w(grid_w_size);

    for (int i = 0; i < grid_h_size; ++i) {
        grid_h[i] = static_cast<float>(i);
    }
    for (int i = 0; i < grid_w_size; ++i) {
        grid_w[i] = static_cast<float>(i);
    }

    std::vector<std::vector<float>> grid(grid_h_size, std::vector<float>(grid_w_size));
    for (int h = 0; h < grid_h_size; ++h) {
        for (int w = 0; w < grid_w_size; ++w) {
            grid[h][w] = grid_w[w];
        }
    }
    std::vector<std::vector<std::vector<float>>> grid_2d = {grid, grid};
    for (int h = 0; h < grid_h_size; ++h) {
        for (int w = 0; w < grid_w_size; ++w) {
            grid_2d[0][h][w] = grid_h[h];
            grid_2d[1][h][w] = grid_w[w];
        }
    }

    std::vector<std::vector<std::vector<float>>> pos_embed_3d = get_2d_sincos_pos_embed_from_grid(embed_dim, grid_2d);

    int H = image_size.first;
    int W = image_size.second;
    std::vector<std::vector<float>> pos_embed_2d(H * W, std::vector<float>(embed_dim));
    for (int h = 0; h < H; ++h) {
        for (int w = 0; w < W; ++w) {
            pos_embed_2d[w * H + h] = pos_embed_3d[h][w];
        }
    }

    return pos_embed_2d;
}